

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scheduler.cpp
# Opt level: O2

void __thiscall SerialTaskRunner::ProcessQueue(SerialTaskRunner *this)

{
  _List_node_base *p_Var1;
  long in_FS_OFFSET;
  function<void_()> callback;
  RAIICallbacksRunning raiicallbacksrunning;
  _Any_data local_58;
  undefined8 local_48;
  undefined8 uStack_40;
  unique_lock<std::mutex> local_30;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  local_48 = 0;
  uStack_40 = 0;
  local_58._M_unused._M_object = (void *)0x0;
  local_58._8_8_ = 0;
  UniqueLock<AnnotatedMixin<std::mutex>_>::UniqueLock
            ((UniqueLock<AnnotatedMixin<std::mutex>_> *)&local_30,&this->m_callbacks_mutex,
             "m_callbacks_mutex",
             "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/scheduler.cpp"
             ,0x95,false);
  if (this->m_are_callbacks_running == false) {
    p_Var1 = (this->m_callbacks_pending).
             super__List_base<std::function<void_()>,_std::allocator<std::function<void_()>_>_>.
             _M_impl._M_node.super__List_node_base._M_next;
    if (p_Var1 != (_List_node_base *)&this->m_callbacks_pending) {
      this->m_are_callbacks_running = true;
      _GLOBAL__N_1::std::function<void_()>::operator=
                ((function<void_()> *)&local_58,(function<void_()> *)(p_Var1 + 1));
      std::__cxx11::list<std::function<void_()>,_std::allocator<std::function<void_()>_>_>::
      pop_front(&this->m_callbacks_pending);
      std::unique_lock<std::mutex>::~unique_lock(&local_30);
      local_30._M_device = (mutex_type *)this;
      _GLOBAL__N_1::std::function<void_()>::operator()((function<void_()> *)&local_58);
      ProcessQueue::RAIICallbacksRunning::~RAIICallbacksRunning((RAIICallbacksRunning *)&local_30);
      goto LAB_00ab7c75;
    }
  }
  std::unique_lock<std::mutex>::~unique_lock(&local_30);
LAB_00ab7c75:
  std::_Function_base::~_Function_base((_Function_base *)&local_58);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void SerialTaskRunner::ProcessQueue()
{
    std::function<void()> callback;
    {
        LOCK(m_callbacks_mutex);
        if (m_are_callbacks_running) return;
        if (m_callbacks_pending.empty()) return;
        m_are_callbacks_running = true;

        callback = std::move(m_callbacks_pending.front());
        m_callbacks_pending.pop_front();
    }

    // RAII the setting of fCallbacksRunning and calling MaybeScheduleProcessQueue
    // to ensure both happen safely even if callback() throws.
    struct RAIICallbacksRunning {
        SerialTaskRunner* instance;
        explicit RAIICallbacksRunning(SerialTaskRunner* _instance) : instance(_instance) {}
        ~RAIICallbacksRunning()
        {
            {
                LOCK(instance->m_callbacks_mutex);
                instance->m_are_callbacks_running = false;
            }
            instance->MaybeScheduleProcessQueue();
        }
    } raiicallbacksrunning(this);

    callback();
}